

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O1

void RemoveChild(nodetree *p,nodetree *Child)

{
  nodetree *pnVar1;
  nodetree *pnVar2;
  nodetree **ppnVar3;
  
  pnVar1 = p->Children;
  if (pnVar1 != (nodetree *)0x0) {
    if (pnVar1 == Child) {
      ppnVar3 = &p->Children;
    }
    else {
      do {
        pnVar2 = pnVar1;
        pnVar1 = pnVar2->Next;
        if (pnVar1 == (nodetree *)0x0) goto LAB_00107161;
      } while (pnVar1 != Child);
      ppnVar3 = &pnVar2->Next;
    }
    *ppnVar3 = Child->Next;
  }
LAB_00107161:
  Child->Parent = (nodetree *)0x0;
  Child->Next = (nodetree *)0x0;
  return;
}

Assistant:

static void RemoveChild(nodetree* p,nodetree* Child)
{
	nodetree** i;

	for (i=&p->Children;*i;i=&(*i)->Next)
		if (*i==Child)
		{
			*i=Child->Next;
			break;
		}

	Child->Next = NULL;
    Child->Parent = NULL;
}